

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaoSolver.cpp
# Opt level: O2

bool __thiscall BaoSolver::checkIfConnect(BaoSolver *this,int v,uint32_t s)

{
  int *__s;
  int iVar1;
  int (*paiVar2) [40];
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  uint local_90;
  int local_8c;
  int (*local_88) [40];
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  __s = this->dis;
  local_8c = v;
  memset(__s,0,0xa0);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
  }
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)&local_80,&local_8c);
  this->dis[local_8c] = 1;
  local_88 = this->edge;
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar1 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    paiVar2 = local_88;
    for (local_90 = 0; (int)local_90 < this->n; local_90 = local_90 + 1) {
      if (((paiVar2[iVar1][(int)local_90] != 0) && ((s >> (local_90 & 0x1f) & 1) != 0)) &&
         (__s[(int)local_90] != 1)) {
        __s[(int)local_90] = 1;
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_80,(value_type *)&local_90);
      }
    }
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->n;
  if (this->n < 1) {
    uVar3 = uVar4;
  }
  bVar5 = true;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if ((s >> ((uint)uVar4 & 0x1f) & 1) != 0) {
      bVar5 = (bool)(bVar5 & (byte)__s[uVar4]);
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
  return bVar5;
}

Assistant:

bool BaoSolver::checkIfConnect(int v, uint32_t s) {
    memset(dis, 0, sizeof(dis));
    queue <int> q;
    while(!q.empty()) q.pop();
    q.push(v); dis[v] = 1;
    while(!q.empty()) {
        int tt = q.front(); q.pop();
        for (int i = 0; i < n; i++) if (edge[tt][i] && ((s >> i) & 1)) {
            if (dis[i] != 1) {
                dis[i] = 1;
                q.push(i);
            }
        }
    }
    bool flag = true;
    for (int i = 0; i < n; i++) if ((s >> i) & 1) {
        flag &= dis[i];
    }
    return flag;
}